

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall Args::Arg::~Arg(Arg *this)

{
  ArgIface *in_RDI;
  
  in_RDI->_vptr_ArgIface = (_func_int **)&PTR__Arg_0017b3e8;
  std::__cxx11::string::~string((string *)&in_RDI[0xd].m_cmdLine);
  std::__cxx11::string::~string((string *)&in_RDI[0xb].m_cmdLine);
  std::__cxx11::string::~string((string *)&in_RDI[9].m_cmdLine);
  std::__cxx11::string::~string((string *)&in_RDI[7].m_cmdLine);
  std::__cxx11::string::~string((string *)&in_RDI[5].m_cmdLine);
  std::__cxx11::string::~string((string *)&in_RDI[3].m_cmdLine);
  std::__cxx11::string::~string((string *)&in_RDI[1].m_cmdLine);
  ArgIface::~ArgIface(in_RDI);
  return;
}

Assistant:

inline
Arg::~Arg()
{
}